

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O0

string * __thiscall
wabt::cat<char[3],char_const*,char[2],wabt::string_view>
          (string *__return_storage_ptr__,wabt *this,char (*args) [3],char **args_1,
          char (*args_2) [2],string_view *args_3)

{
  string_view *args_local_3;
  char (*args_local_2) [2];
  char **args_local_1;
  char (*args_local) [3];
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cat_compute_size<char[3],char_const*,char[2],wabt::string_view>
            ((char (*) [3])this,(char **)args,(char (*) [2])args_1,(string_view *)args_2);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<char[3],char_const*,char[2],wabt::string_view>
            (__return_storage_ptr__,(char (*) [3])this,(char **)args,(char (*) [2])args_1,
             (string_view *)args_2);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
    std::string s;
    s.reserve(cat_compute_size(args...));
    cat_concatenate(s, args...);
    return s;
}